

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O3

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error,string *cmp0115Warning)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  cmake *this_01;
  string *psVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  pointer pbVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exts;
  anon_class_56_7_c6d6a0c4 findInDir;
  string local_138;
  string local_118;
  string local_f8;
  long *local_d8;
  undefined8 local_d0;
  size_type local_c8;
  pointer local_c0;
  undefined8 local_b8;
  cmMakefile *local_b0;
  string *local_a8;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  anon_class_56_7_c6d6a0c4 local_68;
  
  if ((this->IsGenerated != false) ||
     (bVar1 = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_), bVar1)) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_f8,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    this->FindFullPathFailed = false;
    return true;
  }
  if (this->FindFullPathFailed != false) {
    return false;
  }
  this_00 = (this->Location).Makefile;
  cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_118,&this->Location);
  this_01 = cmMakefile::GetCMakeInstance(this_00);
  cmake::GetAllExtensions_abi_cxx11_(&local_80,this_01);
  PVar2 = cmMakefile::GetPolicyStatus(this_00,CMP0115,false);
  PVar3 = cmMakefile::GetPolicyStatus(this_00,CMP0163,false);
  PVar4 = cmMakefile::GetPolicyStatus(this_00,CMP0118,false);
  local_68.cmp0118new = WARN < (PVar4 | PVar3);
  local_68.lPath = &local_118;
  local_68.this = this;
  local_68.exts = &local_80;
  local_68.cmp0115 = PVar2;
  local_68.cmp0115Warning = cmp0115Warning;
  local_68.makefile = this_00;
  if ((this->Location).AmbiguousDirectory == true) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&local_68,psVar5);
    bVar6 = true;
    if (bVar1) goto LAB_003269e8;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&local_68,psVar5);
  }
  else {
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&local_68,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar6 = true;
  if (!bVar1) {
    local_f8._M_dataplus._M_p = (pointer)0x1b;
    local_f8._M_string_length = 0x897283;
    local_f8.field_2._M_allocated_capacity = 0;
    local_d0 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_f8;
    local_f8.field_2._8_8_ = local_118._M_string_length;
    local_d8 = (long *)local_118._M_dataplus._M_p;
    local_b0 = this_00;
    local_a8 = error;
    cmCatViews(&local_138,views);
    if (PVar2 < NEW) {
      local_f8._M_dataplus._M_p = (pointer)local_138._M_string_length;
      local_f8._M_string_length = (size_type)local_138._M_dataplus._M_p;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = 0x11;
      local_d8 = (long *)0x8b49b8;
      local_d0 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_f8;
      cmCatViews(&local_a0,views_00);
      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_80.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_80.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar7 = local_80.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_f8._M_dataplus._M_p = (pointer)local_138._M_string_length;
          local_f8._M_string_length = (size_type)local_138._M_dataplus._M_p;
          local_f8.field_2._M_allocated_capacity = 0;
          local_f8.field_2._8_8_ = 2;
          local_d8 = (long *)0x88b821;
          local_d0 = 0;
          local_c0 = (pbVar7->_M_dataplus)._M_p;
          local_c8 = pbVar7->_M_string_length;
          local_b8 = 0;
          views_01._M_len = 3;
          views_01._M_array = (iterator)&local_f8;
          cmCatViews(&local_a0,views_01);
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          pbVar7 = pbVar7 + 1;
        } while (pbVar7 != local_80.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((local_118._M_string_length == 8) &&
       (*(long *)local_118._M_dataplus._M_p == 0x5445535f454c4946)) {
      std::__cxx11::string::append((char *)&local_138);
    }
    if (local_a8 == (string *)0x0) {
      cmMakefile::IssueMessage(local_b0,FATAL_ERROR,&local_138);
    }
    else {
      std::__cxx11::string::operator=((string *)local_a8,(string *)&local_138);
    }
    this->FindFullPathFailed = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    bVar6 = false;
  }
LAB_003269e8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error,
                                std::string* cmp0115Warning)
{
  // If the file is generated compute the location without checking on disk.
  // Note: We also check for a locally set GENERATED property, because
  //       it might have been set before policy CMP0118 (or CMP0163) was set
  //       to NEW.
  if (this->GetIsGenerated(CheckScope::GlobalAndLocal)) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    this->FindFullPathFailed = false;
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const& lPath = this->Location.GetFullPath();
  // List of extension lists
  std::vector<std::string> exts =
    makefile->GetCMakeInstance()->GetAllExtensions();
  auto cmp0115 = makefile->GetPolicyStatus(cmPolicies::CMP0115);
  auto cmp0163 = makefile->GetPolicyStatus(cmPolicies::CMP0163);
  auto cmp0118 = makefile->GetPolicyStatus(cmPolicies::CMP0118);
  bool const cmp0163new =
    cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
  bool const cmp0118new =
    cmp0163new || (cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN);

  // Tries to find the file in a given directory
  auto findInDir = [this, &exts, &lPath, cmp0115, cmp0115Warning, cmp0118new,
                    makefile](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    // Is this file globally marked as generated? Then mark so locally.
    if (cmp0118new &&
        makefile->GetGlobalGenerator()->IsGeneratedFile(fullPath)) {
      this->IsGenerated = true;
    }
    if (this->IsGenerated || cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // This has to be an if statement due to a bug in Oracle Developer Studio.
    // See https://community.oracle.com/tech/developers/discussion/4476246/
    // for details.
    if (cmp0115 == cmPolicies::OLD || cmp0115 == cmPolicies::WARN) {
      // Try full path with extension
      for (std::string const& ext : exts) {
        if (!ext.empty()) {
          std::string extPath = cmStrCat(fullPath, '.', ext);
          // Is this file globally marked as generated? Then mark so locally.
          if (cmp0118new &&
              makefile->GetGlobalGenerator()->IsGeneratedFile(extPath)) {
            this->IsGenerated = true;
          }
          if (this->IsGenerated || cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            if (cmp0115 == cmPolicies::WARN) {
              std::string warning =
                cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0115),
                         "\nFile:\n  ", extPath);
              if (cmp0115Warning) {
                *cmp0115Warning = std::move(warning);
              } else {
                makefile->GetCMakeInstance()->IssueMessage(
                  MessageType::AUTHOR_WARNING, warning);
              }
            }
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err = cmStrCat("Cannot find source file:\n  ", lPath);
  switch (cmp0115) {
    case cmPolicies::OLD:
    case cmPolicies::WARN:
      err = cmStrCat(err, "\nTried extensions");
      for (auto const& ext : exts) {
        err = cmStrCat(err, " .", ext);
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
  }
  if (lPath == "FILE_SET"_s) {
    err += "\nHint: the FILE_SET keyword may only appear after a visibility "
           "specifier or another FILE_SET within the target_sources() "
           "command.";
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}